

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase2CS::Run(BasicStdLayoutBase2CS *this)

{
  CallLogWrapper *pCVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  void *pvVar7;
  byte bVar8;
  pointer *ppuVar9;
  uint index;
  size_t i;
  ulong uVar10;
  int j;
  long lVar11;
  ulong uVar12;
  long lVar13;
  allocator_type local_24d;
  GLint blocksCS;
  CallLogWrapper *local_248;
  GLuint *local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [4];
  stringstream ss;
  ostream local_1a8;
  
  in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pCVar1 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x90db,&blocksCS);
  if (blocksCS < 8) {
    lVar11 = 0;
  }
  else {
    poVar6 = std::operator<<(&local_1a8,"layout(local_size_x = 1) in;\n");
    iVar4 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this,in_data);
    std::operator<<(poVar6,(char *)CONCAT44(extraout_var,iVar4));
    std::__cxx11::stringbuf::str();
    GVar5 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,(string *)&out_data);
    this->m_program = GVar5;
    std::__cxx11::string::~string((string *)&out_data);
    glu::CallLogWrapper::glLinkProgram(pCVar1,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar3) {
      local_240 = this->m_buffer;
      glu::CallLogWrapper::glGenBuffers(pCVar1,8,local_240);
      ppuVar9 = &in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      index = 0;
      for (lVar11 = -4; lVar11 != 0; lVar11 = lVar11 + 1) {
        glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,index,this->m_buffer[lVar11 + 4]);
        glu::CallLogWrapper::glBufferData
                  (pCVar1,0x90d2,
                   (long)*ppuVar9 - (long)((_Vector_impl_data *)(ppuVar9 + -1))->_M_start,
                   ((_Vector_impl_data *)(ppuVar9 + -1))->_M_start,0x88e4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)*ppuVar9 - (long)((_Vector_impl_data *)(ppuVar9 + -1))->_M_start,&local_24d
                  );
        glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,index | 4,this->m_buffer[lVar11 + 8]);
        glu::CallLogWrapper::glBufferData
                  (pCVar1,0x90d2,
                   (long)*ppuVar9 - (long)((_Vector_impl_data *)(ppuVar9 + -1))->_M_start,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,0x88e4);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        index = index + 1;
        ppuVar9 = ppuVar9 + 3;
      }
      glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
      glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
      bVar8 = 1;
      local_248 = pCVar1;
      for (uVar12 = 0; pCVar1 = local_248, uVar12 != 4; uVar12 = uVar12 + 1) {
        glu::CallLogWrapper::glBindBuffer(local_248,0x90d2,local_240[uVar12 + 4]);
        pvVar7 = glu::CallLogWrapper::glMapBufferRange
                           (pCVar1,0x90d2,0,
                            (long)in_data[uVar12].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)in_data[uVar12].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,1);
        if (pvVar7 == (void *)0x0) break;
        for (uVar10 = 0;
            puVar2 = in_data[uVar12].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar10 < (ulong)((long)in_data[uVar12].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
            uVar10 = uVar10 + 1) {
          if (puVar2[uVar10] != *(uchar *)((long)pvVar7 + uVar10)) {
            bVar8 = 0;
            anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar10 & 0xffffffff);
          }
        }
        glu::CallLogWrapper::glUnmapBuffer(local_248,0x90d2);
      }
      lVar11 = -1;
      if (3 < uVar12) {
        lVar11 = -(ulong)(~bVar8 & 1);
      }
    }
    else {
      lVar11 = -1;
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  lVar13 = 0x48;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  return lVar11;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data[4];
		std::stringstream	ss;
		GLint				 blocksCS;
		glGetIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &blocksCS);
		if (blocksCS < 8)
			return NO_ERROR;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);
		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_buffer);

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &in_data[i][0], GL_STATIC_DRAW);

			std::vector<GLubyte> out_data(in_data[i].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_buffer[i + 4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;
		for (int j = 0; j < 4; ++j)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 4]);
			GLubyte* out_data =
				(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), GL_MAP_READ_BIT);
			if (!out_data)
				return ERROR;

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}